

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall cs::token_signal::dump(token_signal *this,ostream *o)

{
  long lVar1;
  char *pcVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< Signal = \"",0xc);
  switch(this->mType) {
  case endline_:
    pcVar2 = "[endline]";
    lVar1 = 9;
    goto LAB_00126d4a;
  case add_:
    pcVar2 = "+";
    break;
  case addasi_:
    pcVar2 = "+=";
    goto LAB_00126d12;
  case sub_:
  case minus_:
    pcVar2 = "-";
    break;
  case subasi_:
    pcVar2 = "-=";
    goto LAB_00126d12;
  case mul_:
  case escape_:
    pcVar2 = "*";
    break;
  case mulasi_:
    pcVar2 = "*=";
    goto LAB_00126d12;
  case div_:
    pcVar2 = "/";
    break;
  case divasi_:
    pcVar2 = "/=";
    goto LAB_00126d12;
  case mod_:
    pcVar2 = "%";
    break;
  case modasi_:
    pcVar2 = "%=";
    goto LAB_00126d12;
  case pow_:
    pcVar2 = "^";
    break;
  case powasi_:
    pcVar2 = "^=";
    goto LAB_00126d12;
  case com_:
    pcVar2 = ",";
    break;
  case dot_:
    pcVar2 = ".";
    break;
  case und_:
    pcVar2 = "<";
    break;
  case abo_:
    pcVar2 = ">";
    break;
  case asi_:
  case bind_:
    pcVar2 = "=";
    break;
  case lnkasi_:
    pcVar2 = ":=";
    goto LAB_00126d12;
  case equ_:
    pcVar2 = "==";
    goto LAB_00126d12;
  case ueq_:
    pcVar2 = "<=";
    goto LAB_00126d12;
  case aeq_:
    pcVar2 = ">=";
    goto LAB_00126d12;
  case neq_:
    pcVar2 = "!=";
    goto LAB_00126d12;
  case and_:
    pcVar2 = "&&";
    goto LAB_00126d12;
  case or_:
    pcVar2 = "||";
    goto LAB_00126d12;
  case not_:
    pcVar2 = "!";
    break;
  case inc_:
    pcVar2 = "++";
    goto LAB_00126d12;
  case dec_:
    pcVar2 = "--";
    goto LAB_00126d12;
  case pair_:
    pcVar2 = ":";
    break;
  case choice_:
    pcVar2 = "?";
    break;
  case slb_:
    pcVar2 = "(";
    break;
  case srb_:
    pcVar2 = ")";
    break;
  case mlb_:
    pcVar2 = "[";
    break;
  case mrb_:
    pcVar2 = "]";
    break;
  case llb_:
    pcVar2 = "{";
    break;
  case lrb_:
    pcVar2 = "}";
    break;
  case esb_:
    pcVar2 = "()";
    goto LAB_00126d12;
  case emb_:
    pcVar2 = "[]";
    goto LAB_00126d12;
  case elb_:
    pcVar2 = "{}";
    goto LAB_00126d12;
  case fcall_:
    pcVar2 = "[call]";
    goto LAB_00126cdb;
  case access_:
    pcVar2 = "[access]";
    goto LAB_00126d45;
  case typeid_:
    pcVar2 = "typeid";
LAB_00126cdb:
    lVar1 = 6;
    goto LAB_00126d4a;
  case addr_:
    pcVar2 = "&";
    break;
  case new_:
    pcVar2 = "new";
    lVar1 = 3;
    goto LAB_00126d4a;
  case gcnew_:
    pcVar2 = "gcnew";
    lVar1 = 5;
    goto LAB_00126d4a;
  case arrow_:
    pcVar2 = "->";
LAB_00126d12:
    lVar1 = 2;
    goto LAB_00126d4a;
  case lambda_:
    pcVar2 = "[lambda]";
    goto LAB_00126d45;
  case vardef_:
    pcVar2 = "[vardef]";
    goto LAB_00126d45;
  case varchk_:
    pcVar2 = "[varchk]";
    goto LAB_00126d45;
  case varprt_:
    pcVar2 = "[varprt]";
LAB_00126d45:
    lVar1 = 8;
    goto LAB_00126d4a;
  case vargs_:
    pcVar2 = "[vargs]";
    goto LAB_00126d20;
  case error_:
    pcVar2 = "[error]";
LAB_00126d20:
    lVar1 = 7;
    goto LAB_00126d4a;
  default:
    goto switchD_00126ae8_default;
  }
  lVar1 = 1;
LAB_00126d4a:
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,lVar1);
switchD_00126ae8_default:
  std::__ostream_insert<char,std::char_traits<char>>(o,"\" >",3);
  return false;
}

Assistant:

bool token_signal::dump(std::ostream &o) const
	{
		o << "< Signal = \"";
		switch (mType) {
		case signal_types::add_:
			o << "+";
			break;
		case signal_types::addasi_:
			o << "+=";
			break;
		case signal_types::sub_:
			o << "-";
			break;
		case signal_types::subasi_:
			o << "-=";
			break;
		case signal_types::mul_:
			o << "*";
			break;
		case signal_types::mulasi_:
			o << "*=";
			break;
		case signal_types::div_:
			o << "/";
			break;
		case signal_types::divasi_:
			o << "/=";
			break;
		case signal_types::mod_:
			o << "%";
			break;
		case signal_types::modasi_:
			o << "%=";
			break;
		case signal_types::pow_:
			o << "^";
			break;
		case signal_types::powasi_:
			o << "^=";
			break;
		case signal_types::com_:
			o << ",";
			break;
		case signal_types::dot_:
			o << ".";
			break;
		case signal_types::und_:
			o << "<";
			break;
		case signal_types::abo_:
			o << ">";
			break;
		case signal_types::asi_:
			o << "=";
			break;
		case signal_types::lnkasi_:
			o << ":=";
			break;
		case signal_types::equ_:
			o << "==";
			break;
		case signal_types::ueq_:
			o << "<=";
			break;
		case signal_types::aeq_:
			o << ">=";
			break;
		case signal_types::neq_:
			o << "!=";
			break;
		case signal_types::and_:
			o << "&&";
			break;
		case signal_types::or_:
			o << "||";
			break;
		case signal_types::not_:
			o << "!";
			break;
		case signal_types::inc_:
			o << "++";
			break;
		case signal_types::dec_:
			o << "--";
			break;
		case signal_types::pair_:
			o << ":";
			break;
		case signal_types::choice_:
			o << "?";
			break;
		case signal_types::slb_:
			o << "(";
			break;
		case signal_types::srb_:
			o << ")";
			break;
		case signal_types::mlb_:
			o << "[";
			break;
		case signal_types::mrb_:
			o << "]";
			break;
		case signal_types::llb_:
			o << "{";
			break;
		case signal_types::lrb_:
			o << "}";
			break;
		case signal_types::esb_:
			o << "()";
			break;
		case signal_types::emb_:
			o << "[]";
			break;
		case signal_types::elb_:
			o << "{}";
			break;
		case signal_types::fcall_:
			o << "[call]";
			break;
		case signal_types::access_:
			o << "[access]";
			break;
		case signal_types::typeid_:
			o << "typeid";
			break;
		case signal_types::addr_:
			o << "&";
			break;
		case signal_types::new_:
			o << "new";
			break;
		case signal_types::gcnew_:
			o << "gcnew";
			break;
		case signal_types::arrow_:
			o << "->";
			break;
		case signal_types::lambda_:
			o << "[lambda]";
			break;
		case signal_types::escape_:
			o << "*";
			break;
		case signal_types::minus_:
			o << "-";
			break;
		case signal_types::vardef_:
			o << "[vardef]";
			break;
		case signal_types::varchk_:
			o << "[varchk]";
			break;
		case signal_types::varprt_:
			o << "[varprt]";
			break;
		case signal_types::vargs_:
			o << "[vargs]";
			break;
		case signal_types::bind_:
			o << "=";
			break;
		case signal_types::error_:
			o << "[error]";
			break;
		case signal_types::endline_:
			o << "[endline]";
			break;
		}
		o << "\" >";
		return false;
	}